

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void proto2_unittest::TestRequiredForeign::SharedDtor(MessageLite *self)

{
  TestRequired *this;
  MessageLite *self_00;
  ulong uVar1;
  undefined8 extraout_RAX;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (TestRequired *)self[3]._vptr_MessageLite;
    if (this != (TestRequired *)0x0) {
      TestRequired::~TestRequired(this);
      operator_delete(this,0xa8);
    }
    self_00 = (MessageLite *)self[3]._internal_metadata_.ptr_;
    if (self_00 != (MessageLite *)0x0) {
      NestedTestAllTypes::SharedDtor(self_00);
      operator_delete(self_00,0x50);
    }
    google::protobuf::RepeatedPtrField<proto2_unittest::TestRequired>::~RepeatedPtrField
              ((RepeatedPtrField<proto2_unittest::TestRequired> *)&self[1]._internal_metadata_);
    return;
  }
  SharedDtor((TestRequiredForeign *)&stack0xffffffffffffffe0);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

inline void TestRequiredForeign::SharedDtor(MessageLite& self) {
  TestRequiredForeign& this_ = static_cast<TestRequiredForeign&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.optional_message_;
  delete this_._impl_.optional_lazy_message_;
  this_._impl_.~Impl_();
}